

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void Search::add_neighbor_features(search_private *priv,multi_ex *ec_seq)

{
  uint uVar1;
  vw *pvVar2;
  pointer ppeVar3;
  int *piVar4;
  char cVar5;
  ostream *poVar6;
  char cVar7;
  uint32_t *puVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint64_t idx;
  ulong uVar12;
  example *this;
  allocator local_89;
  multi_ex *local_88;
  ostream *local_80;
  uint64_t local_78;
  uint64_t local_70;
  string *local_68;
  example *local_60;
  ulong local_58;
  string local_50 [32];
  
  if ((priv->neighbor_features)._end != (priv->neighbor_features)._begin) {
    pvVar2 = priv->all;
    puVar8 = &(pvVar2->weights).dense_weights._stride_shift;
    if ((pvVar2->weights).sparse != false) {
      puVar8 = &(pvVar2->weights).sparse_weights._stride_shift;
    }
    local_78 = 0x3a5d15L << ((byte)*puVar8 & 0x3f);
    local_68 = (string *)&priv->field_0x370;
    local_80 = (ostream *)&priv->field_0x368;
    local_70 = 0x372faf1dL << ((byte)*puVar8 & 0x3f);
    local_88 = ec_seq;
    for (uVar11 = 0;
        ppeVar3 = (local_88->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar11 < (ulong)((long)(local_88->super__Vector_base<example_*,_std::allocator<example_*>_>)
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppeVar3 >> 3);
        uVar11 = uVar11 + 1) {
      this = ppeVar3[uVar11];
      local_60 = this;
      local_58 = uVar11;
      for (uVar12 = 0; piVar4 = (priv->neighbor_features)._begin,
          uVar12 < (ulong)((long)(priv->neighbor_features)._end - (long)piVar4 >> 2);
          uVar12 = uVar12 + 1) {
        uVar1 = piVar4[uVar12];
        iVar9 = (int)uVar1 >> 0x18;
        priv->dat_new_feature_ec = this;
        priv->dat_new_feature_value = 1.0;
        priv->dat_new_feature_idx = (long)piVar4[uVar12] * 0xd1c79f;
        priv->dat_new_feature_namespace = 0x83;
        if (priv->all->audit == true) {
          priv->dat_new_feature_feature_space = (string *)neighbor_feature_space_abi_cxx11_;
          std::__cxx11::string::string(local_50,"",&local_89);
          std::__cxx11::stringbuf::str(local_68);
          std::__cxx11::string::~string(local_50);
          poVar6 = std::operator<<(local_80,'@');
          poVar6 = std::operator<<(poVar6,(iVar9 < 1) * '\x02' + '+');
          cVar5 = (char)(uVar1 >> 0x18);
          cVar7 = -cVar5;
          if (0 < iVar9) {
            cVar7 = cVar5;
          }
          std::operator<<(poVar6,cVar7 + '0');
          this = local_60;
          if ((uVar1 & 0xff) != 0x20) {
            std::operator<<(local_80,(char)uVar1);
          }
        }
        uVar11 = local_58;
        idx = local_70;
        if (local_58 < (uint)-iVar9 && iVar9 < 0) {
LAB_0011b0cb:
          add_new_feature(priv,1.0,idx);
        }
        else {
          ppeVar3 = (local_88->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          idx = local_78;
          if ((ulong)((long)(local_88->super__Vector_base<example_*,_std::allocator<example_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar3 >> 3) <=
              (long)iVar9 + local_58) goto LAB_0011b0cb;
          GD::foreach_feature<Search::search_private,_&Search::add_new_feature,_vw_*>
                    (&priv->all,
                     (ppeVar3[(long)iVar9 + local_58]->super_example_predict).feature_space +
                     (uVar1 & 0xff),priv,(this->super_example_predict).ft_offset,1.0);
        }
      }
      lVar10 = (long)(this->super_example_predict).feature_space[0x83].values._end -
               (long)(this->super_example_predict).feature_space[0x83].values._begin;
      if ((lVar10 == 0) || ((this->super_example_predict).feature_space[0x83].sum_feat_sq <= 0.0)) {
        features::clear((this->super_example_predict).feature_space + 0x83);
      }
      else {
        v_array<unsigned_char>::push_back((v_array<unsigned_char> *)this,&neighbor_namespace);
        this->total_sum_feat_sq =
             (this->super_example_predict).feature_space[0x83].sum_feat_sq + this->total_sum_feat_sq
        ;
        this->num_features = this->num_features + (lVar10 >> 2);
      }
    }
  }
  return;
}

Assistant:

void add_neighbor_features(search_private& priv, multi_ex& ec_seq)
{
  if (priv.neighbor_features.size() == 0)
    return;

  uint32_t stride_shift = priv.all->weights.stride_shift();
  for (size_t n = 0; n < ec_seq.size(); n++)  // iterate over every example in the sequence
  {
    example& me = *ec_seq[n];
    for (size_t n_id = 0; n_id < priv.neighbor_features.size(); n_id++)
    {
      int32_t offset = priv.neighbor_features[n_id] >> 24;
      size_t ns = priv.neighbor_features[n_id] & 0xFF;

      priv.dat_new_feature_ec = &me;
      priv.dat_new_feature_value = 1.;
      priv.dat_new_feature_idx = priv.neighbor_features[n_id] * 13748127;
      priv.dat_new_feature_namespace = neighbor_namespace;
      if (priv.all->audit)
      {
        priv.dat_new_feature_feature_space = &neighbor_feature_space;
        priv.dat_new_feature_audit_ss.str("");
        priv.dat_new_feature_audit_ss << '@' << ((offset > 0) ? '+' : '-') << (char)(abs(offset) + '0');
        if (ns != ' ')
          priv.dat_new_feature_audit_ss << (char)ns;
      }

      // cerr << "n=" << n << " offset=" << offset << endl;
      if ((offset < 0) && (n < (uint64_t)(-offset)))  // add <s> feature
        add_new_feature(priv, 1., (uint64_t)925871901 << stride_shift);
      else if (n + offset >= ec_seq.size())  // add </s> feature
        add_new_feature(priv, 1., (uint64_t)3824917 << stride_shift);
      else  // this is actually a neighbor
      {
        example& other = *ec_seq[n + offset];
        GD::foreach_feature<search_private, add_new_feature>(priv.all, other.feature_space[ns], priv, me.ft_offset);
      }
    }

    features& fs = me.feature_space[neighbor_namespace];
    size_t sz = fs.size();
    if ((sz > 0) && (fs.sum_feat_sq > 0.))
    {
      me.indices.push_back(neighbor_namespace);
      me.total_sum_feat_sq += fs.sum_feat_sq;
      me.num_features += sz;
    }
    else
      fs.clear();
  }
}